

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void helicsCoreSendOrderedCommand(HelicsCore core,char *target,char *command,HelicsError *err)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long in_RDX;
  long in_RSI;
  Core *cppcore;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 uVar2;
  char *in_stack_ffffffffffffff68;
  undefined1 *puVar3;
  undefined1 local_78 [32];
  __sv_type local_58;
  __sv_type local_48;
  __sv_type local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         getCore(in_stack_ffffffffffffff68,
                 (HelicsError *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (this != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_28 = this;
    if (local_10 == 0) {
      local_38 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this,in_stack_ffffffffffffff68)
      ;
    }
    if (local_18 == 0) {
      local_48 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this,in_stack_ffffffffffffff68)
      ;
    }
    puVar3 = local_78;
    std::__cxx11::string::string(this);
    local_58 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    uVar1 = local_58._M_str._0_4_;
    uVar2 = local_58._M_str._4_4_;
    (**(code **)((this->_M_dataplus)._M_p + 0x2d8))
              (this,local_38._M_len,local_38._M_str,local_48._M_len,local_48._M_str,1,
               (undefined4)local_58._M_len,local_58._M_str._0_4_,puVar3);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(uVar2,uVar1));
  }
  return;
}

Assistant:

void helicsCoreSendOrderedCommand(HelicsCore core, const char* target, const char* command, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    try {
        cppcore->sendCommand(AS_STRING_VIEW(target), AS_STRING_VIEW(command), std::string{}, HELICS_SEQUENCING_MODE_ORDERED);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}